

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O1

void __thiscall ev3dev::led::off(led *this)

{
  led local_30;
  
  set_brightness(&local_30,this,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.super_device._path._M_dataplus._M_p != &local_30.super_device._path.field_2) {
    operator_delete(local_30.super_device._path._M_dataplus._M_p);
  }
  return;
}

Assistant:

void off() { set_brightness(0); }